

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O1

void __thiscall CMU462::DynamicScene::XFormWidget::drawTranslateHandles(XFormWidget *this)

{
  double *pdVar1;
  bool bVar2;
  bool bVar3;
  pointer pVVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double __x;
  double dVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined4 uVar15;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar16;
  undefined4 extraout_XMM0_Dd;
  double dVar17;
  Vector3D c;
  undefined1 local_168 [16];
  double local_158;
  double local_148;
  double dStack_140;
  double local_138;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  double local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  double local_d8;
  double local_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  double local_88;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  double local_68;
  double dStack_60;
  double local_58;
  double local_48;
  double dStack_40;
  double local_38;
  
  if ((this->target).object != (SceneObject *)0x0) {
    bVar2 = this->objectMode;
    bVar3 = this->transformedMode;
    local_148 = (this->center).x;
    dStack_140 = (this->center).y;
    local_138 = (this->center).z;
    dVar7 = (this->bounds).max.x - (this->bounds).min.x;
    dVar17 = (this->bounds).max.y - (this->bounds).min.y;
    uVar15 = 0;
    uVar16 = 0;
    dVar5 = (this->bounds).max.z - (this->bounds).min.z;
    dVar5 = dVar5 * dVar5 + dVar7 * dVar7 + dVar17 * dVar17;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
      uVar15 = extraout_XMM0_Dc;
      uVar16 = extraout_XMM0_Dd;
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    local_128._8_4_ = uVar15;
    local_128._0_8_ = dVar5 * 0.5;
    local_128._12_4_ = uVar16;
    glLineWidth(0x41000000);
    glBegin(1);
    local_108 = (double)local_128._0_8_ * 0.85;
    uVar12 = 0;
    if (bVar3 != false) {
      uVar12 = (ulong)(((byte)~bVar2 & 1) * 2);
    }
    uStack_100 = 0;
    local_118._8_4_ = SUB84(local_108,0);
    local_118._0_8_ = local_108;
    local_118._12_4_ = (int)((ulong)local_108 >> 0x20);
    lVar11 = (ulong)(uint)((int)uVar12 * 8) * 3;
    do {
      pVVar4 = (this->axes).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_d8 = *(double *)((long)&pVVar4->z + lVar11) * local_108 + local_138;
      pdVar1 = (double *)((long)&pVVar4->x + lVar11);
      dVar5 = pdVar1[1] * (double)local_118._8_8_ + dStack_140;
      local_e8._8_4_ = SUB84(dVar5,0);
      local_e8._0_8_ = *pdVar1 * (double)local_118._0_8_ + local_148;
      local_e8._12_4_ = (int)((ulong)dVar5 >> 0x20);
      glColor4ubv(*(undefined8 *)
                   ((long)&(((this->axisColors).
                             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data + lVar11));
      glVertex3dv(&local_148);
      glVertex3dv(local_e8);
      lVar11 = lVar11 + 0x18;
    } while (lVar11 != 0x48);
    glEnd();
    glBegin(4);
    local_88 = local_128._0_8_ * 0.5 * 0.15;
    uStack_80 = 0;
    local_98._8_4_ = SUB84(local_88,0);
    local_98._0_8_ = local_88;
    local_98._12_4_ = (int)((ulong)local_88 >> 0x20);
    local_a8._8_4_ = local_128._0_4_;
    local_a8._0_8_ = local_128._0_8_;
    local_a8._12_4_ = local_128._4_4_;
    do {
      pVVar4 = (this->axes).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_d8 = pVVar4[uVar12].z * (double)CONCAT44(local_128._4_4_,local_128._0_4_) + local_138;
      local_e8._8_8_ = pVVar4[uVar12].y * (double)local_a8._8_8_ + dStack_140;
      local_e8._0_8_ = pVVar4[uVar12].x * (double)local_a8._0_8_ + local_148;
      local_158 = pVVar4[uVar12].z * local_108 + local_138;
      dVar5 = pVVar4[uVar12].y * (double)local_118._8_8_ + dStack_140;
      local_168._8_4_ = SUB84(dVar5,0);
      local_168._0_8_ = pVVar4[uVar12].x * (double)local_118._0_8_ + local_148;
      local_168._12_4_ = (int)((ulong)dVar5 >> 0x20);
      uVar13 = uVar12 + 1;
      uVar14 = uVar13 & 0xffffffff;
      if (uVar13 == 3) {
        uVar14 = 0;
      }
      dVar5 = pVVar4[uVar14].z * local_88;
      uVar9 = ((int)uVar12 + 2U) % 3;
      local_b8 = pVVar4[uVar14].x * (double)local_98._0_8_;
      dStack_b0 = pVVar4[uVar14].y * (double)local_98._8_8_;
      local_c8 = pVVar4[uVar9].x * (double)local_98._0_8_;
      dStack_c0 = pVVar4[uVar9].y * (double)local_98._8_8_;
      dVar7 = pVVar4[uVar9].z * local_88;
      glColor4ubv((this->axisColors).
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar12].
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start);
      uVar15 = 0;
      uVar16 = 0;
      iVar10 = 1;
      do {
        dVar17 = (double)CONCAT44(uVar16,uVar15) * 6.283185307179586 * 0.125;
        local_f8._0_8_ = dVar17;
        local_d0 = (double)CONCAT44(uVar16,uVar15) + 1.0;
        __x = (double)iVar10 * 6.283185307179586 * 0.125;
        dVar17 = cos(dVar17);
        dVar8 = dVar5 * dVar17 + local_158;
        dVar6 = dVar17 * dStack_b0 + (double)local_168._8_8_;
        local_78._8_4_ = SUB84(dVar6,0);
        local_78._0_8_ = dVar17 * local_b8 + (double)local_168._0_8_;
        local_78._12_4_ = (int)((ulong)dVar6 >> 0x20);
        dVar17 = sin((double)local_f8._0_8_);
        local_48 = (double)local_78._0_8_ - dVar17 * local_c8;
        dStack_40 = (double)local_78._8_8_ - dVar17 * dStack_c0;
        local_38 = dVar8 - dVar7 * dVar17;
        dVar17 = cos(__x);
        dVar8 = dVar5 * dVar17 + local_158;
        dVar6 = dVar17 * dStack_b0 + (double)local_168._8_8_;
        local_f8._8_4_ = SUB84(dVar6,0);
        local_f8._0_8_ = dVar17 * local_b8 + (double)local_168._0_8_;
        local_f8._12_4_ = (int)((ulong)dVar6 >> 0x20);
        dVar17 = sin(__x);
        local_68 = (double)local_f8._0_8_ - dVar17 * local_c8;
        dStack_60 = (double)local_f8._8_8_ - dVar17 * dStack_c0;
        local_58 = dVar8 - dVar7 * dVar17;
        glVertex3dv(local_e8);
        glVertex3dv(&local_48);
        glVertex3dv(&local_68);
        glVertex3dv(&local_48);
        glVertex3dv(local_168);
        glVertex3dv(&local_68);
        uVar15 = SUB84(local_d0,0);
        uVar16 = (undefined4)((ulong)local_d0 >> 0x20);
        iVar10 = iVar10 + 1;
      } while (iVar10 != 9);
      uVar12 = uVar13;
    } while (uVar13 != 3);
    glEnd();
    if ((this->transformedMode == false) || (this->objectMode == true)) {
      drawCenterHandle(this);
    }
    glLineWidth(0x3f800000);
  }
  return;
}

Assistant:

void XFormWidget::drawTranslateHandles() const {
  const double arrowSize = .15;
  const int nSides = 8;

  if (target.object == nullptr) return;

  int startAxis = (transformedMode && !objectMode) ? 2 : 0;

  Vector3D c = center;
  double r = (bounds.max - bounds.min).norm() / 2.;

  // Draw arrow stems
  glLineWidth(8.);
  glBegin(GL_LINES);
  for (int i = startAxis; i < 3; i++) {
    Vector3D b = c + (1. - arrowSize) * r * axes[i];

    glColor4ubv(&axisColors[i][0]);

    glVertex3dv(&c.x);
    glVertex3dv(&b.x);
  }
  glEnd();

  // Draw arrow heads
  glBegin(GL_TRIANGLES);
  for (int i = startAxis; i < 3; i++) {
    Vector3D a = c + r * axes[i];
    Vector3D b = c + (1. - arrowSize) * r * axes[i];
    Vector3D e0 = r * .5 * arrowSize * axes[(i + 1) % 3];
    Vector3D e1 = r * .5 * arrowSize * axes[(i + 2) % 3];

    glColor4ubv(&axisColors[i][0]);

    for (int j = 0; j < nSides; j++) {
      double theta1 = 2. * M_PI * (double)j / (double)nSides;
      double theta2 = 2. * M_PI * (double)(j + 1) / (double)nSides;
      Vector3D p0 = b + cos(theta1) * e0 - sin(theta1) * e1;
      Vector3D p1 = b + cos(theta2) * e0 - sin(theta2) * e1;

      glVertex3dv(&a.x);
      glVertex3dv(&p0.x);
      glVertex3dv(&p1.x);

      glVertex3dv(&p0.x);
      glVertex3dv(&b.x);
      glVertex3dv(&p1.x);
    }
  }
  glEnd();

  if (!transformedMode || objectMode) drawCenterHandle();
  glLineWidth(1.);
}